

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit.c
# Opt level: O0

sexp_conflict sexp_fixnum_to_twos_complement(sexp_conflict ctx,sexp_conflict x,int len)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  sexp_conflict psVar5;
  int in_EDX;
  ulong in_RSI;
  long in_RDI;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_conflict res;
  int i;
  long *local_30;
  undefined8 local_28;
  long local_20;
  int local_18;
  int local_14;
  ulong local_10;
  long local_8;
  
  local_20 = 0x43e;
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memset(&local_30,0,0x10);
  local_30 = &local_20;
  local_28 = *(undefined8 *)(local_8 + 0x6080);
  *(long ***)(local_8 + 0x6080) = &local_30;
  local_20 = sexp_make_bignum(local_8,(long)local_14);
  auVar1._8_8_ = (long)local_10 >> 0x3f;
  auVar1._0_8_ = local_10 & 0xfffffffffffffffe;
  iVar4 = local_14;
  if (SUB168(auVar1 / SEXT816(2),0) < 0) {
    while (local_18 = iVar4 + -1, 0 < local_18) {
      *(undefined8 *)(local_20 + 0x18 + (long)local_18 * 8) = 0xffffffffffffffff;
      iVar4 = local_18;
    }
  }
  auVar2._8_8_ = (long)local_10 >> 0x3f;
  auVar2._0_8_ = local_10 & 0xfffffffffffffffe;
  *(ulong *)(local_20 + 0x18) = -SUB168(auVar2 / SEXT816(2),0) ^ 0xffffffffffffffff;
  psVar5 = (sexp_conflict)sexp_bignum_fxadd(local_8,local_20,1);
  if (((psVar5->value).type.cpl == (sexp)(long)(local_14 + 1)) &&
     (*(long *)((long)&psVar5->value + (long)local_14 * 8 + 0x10) == 1)) {
    *(undefined8 *)((long)&psVar5->value + (long)local_14 * 8 + 0x10) = 0xffffffffffffffff;
  }
  auVar3._8_8_ = (long)local_10 >> 0x3f;
  auVar3._0_8_ = local_10 & 0xfffffffffffffffe;
  if (SUB168(auVar3 / SEXT816(2),0) < 0) {
    (psVar5->value).flonum_bits[0] = -1;
  }
  *(undefined8 *)(local_8 + 0x6080) = local_28;
  return psVar5;
}

Assistant:

static sexp sexp_fixnum_to_twos_complement (sexp ctx, sexp x, int len) {
  int i;
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  res = sexp_make_bignum(ctx, len);
  if (sexp_unbox_fixnum(x) < 0)
    for (i = len-1; i > 0; i--)
      sexp_bignum_data(res)[i] = (sexp_uint_t)((sexp_sint_t)-1);
  sexp_bignum_data(res)[0] = ~(-(sexp_unbox_fixnum(x)));
  res = sexp_bignum_fxadd(ctx, res, 1);
  if (sexp_bignum_length(res) == len + 1 && sexp_bignum_data(res)[len] == 1)
    sexp_bignum_data(res)[len] = -1;
  if (sexp_unbox_fixnum(x) < 0)
    sexp_bignum_sign(res) = -1;
  sexp_gc_release1(ctx);
  return res;
}